

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBoxPrivate::addOldButtons(QMessageBoxPrivate *this,int button0,int button1,int button2)

{
  bool bVar1;
  QMessageBoxPrivate *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QMessageBoxPrivate *in_RDI;
  QMessageBox *q;
  undefined8 in_stack_ffffffffffffffb8;
  StandardButton button;
  QMessageBoxPrivate *this_01;
  QMessageBox *in_stack_ffffffffffffffc0;
  QMessageBoxPrivate *this_02;
  QMessageBoxPrivate *pQVar2;
  QMessageBoxPrivate *in_stack_ffffffffffffffd0;
  
  button = (StandardButton)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = (QMessageBoxPrivate *)q_func(in_RDI);
  newButton(in_ESI);
  QMessageBox::addButton(in_stack_ffffffffffffffc0,button);
  this_01 = this_00;
  newButton(in_EDX);
  QMessageBox::addButton(in_stack_ffffffffffffffc0,(StandardButton)((ulong)this_01 >> 0x20));
  this_02 = this_00;
  newButton(in_ECX);
  QMessageBox::addButton((QMessageBox *)this_02,(StandardButton)((ulong)this_01 >> 0x20));
  pQVar2 = this_00;
  findButton(in_stack_ffffffffffffffd0,(int)((ulong)this_00 >> 0x20),(int)this_00,
             (int)((ulong)this_02 >> 0x20),(int)this_02);
  QMessageBox::setDefaultButton((QMessageBox *)this_01,(QPushButton *)in_RDI);
  findButton(this_00,(int)((ulong)pQVar2 >> 0x20),(int)pQVar2,(int)((ulong)this_02 >> 0x20),
             (int)this_02);
  QMessageBox::setEscapeButton((QMessageBox *)this_01,(QAbstractButton *)in_RDI);
  bVar1 = detectedCompat(in_ESI,in_EDX,in_ECX);
  in_RDI->compatMode = bVar1;
  return;
}

Assistant:

void QMessageBoxPrivate::addOldButtons(int button0, int button1, int button2)
{
    Q_Q(QMessageBox);
    q->addButton(newButton(button0));
    q->addButton(newButton(button1));
    q->addButton(newButton(button2));
    q->setDefaultButton(
        static_cast<QPushButton *>(findButton(button0, button1, button2, QMessageBox::Default)));
    q->setEscapeButton(findButton(button0, button1, button2, QMessageBox::Escape));
    compatMode = detectedCompat(button0, button1, button2);
}